

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O0

void __thiscall
iutest::detail::TestInstance<iu_InformTest_x_iutest_x_A_Test>::TestInstance
          (TestInstance<iu_InformTest_x_iutest_x_A_Test> *this,string *testsuite,char *name,
          TestTypeId id,SetUpMethod setup,TearDownMethod teardown)

{
  TestTypeId __s;
  TestSuite *pTVar1;
  UnitTest *this_00;
  allocator<char> local_59;
  string local_58;
  TearDownMethod local_38;
  TearDownMethod teardown_local;
  SetUpMethod setup_local;
  TestTypeId id_local;
  char *name_local;
  string *testsuite_local;
  TestInstance<iu_InformTest_x_iutest_x_A_Test> *this_local;
  
  local_38 = teardown;
  teardown_local = setup;
  setup_local = (SetUpMethod)id;
  id_local = name;
  name_local = (char *)testsuite;
  testsuite_local = (string *)this;
  pTVar1 = AddTestSuite(this,testsuite,id,setup,teardown);
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,pTVar1);
  __s = id_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_58,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  iuFactory<iu_InformTest_x_iutest_x_A_Test>::iuFactory(&this->m_factory);
  this_00 = UnitTest::instance();
  pTVar1 = iuITestSuiteMediator::ptr((iuITestSuiteMediator *)this);
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,pTVar1,&this->m_info);
  return;
}

Assistant:

TestInstance(const ::std::string& testsuite, const char* name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown)
        : m_mediator(AddTestSuite(testsuite, id, setup, teardown))
        , m_info(&m_mediator, name, &m_factory)
    {
        UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
    }